

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emu2413.c
# Opt level: O2

void reset_rate_conversion_params(EOPLL *opll)

{
  EOPLL_RateConv *conv;
  double __x;
  double dVar1;
  double f_out;
  
  f_out = (double)opll->rate;
  __x = (double)opll->clk / 72.0;
  opll->out_time = 0.0;
  opll->out_step = __x;
  opll->inp_step = f_out;
  if (opll->conv != (EOPLL_RateConv *)0x0) {
    EOPLL_RateConv_delete(opll->conv);
    opll->conv = (EOPLL_RateConv *)0x0;
  }
  dVar1 = floor(__x);
  if ((dVar1 != f_out) || (NAN(dVar1) || NAN(f_out))) {
    dVar1 = floor(__x + 0.5);
    if ((dVar1 != f_out) || (NAN(dVar1) || NAN(f_out))) {
      conv = EOPLL_RateConv_new(__x,f_out,2);
      opll->conv = conv;
      if (conv == (EOPLL_RateConv *)0x0) {
        return;
      }
      EOPLL_RateConv_reset(conv);
      return;
    }
  }
  opll->inp_step = opll->out_step;
  return;
}

Assistant:

static void reset_rate_conversion_params(EOPLL *opll) {
  const double f_out = opll->rate;
  const double f_inp = opll->clk / 72.0;

  opll->out_time = 0;
  opll->out_step = f_inp;
  opll->inp_step = f_out;

  if (opll->conv) {
    EOPLL_RateConv_delete(opll->conv);
    opll->conv = NULL;
  }

  if (floor(f_inp) != f_out && floor(f_inp + 0.5) != f_out) {
    opll->conv = EOPLL_RateConv_new(f_inp, f_out, 2);
  } else {
    opll->inp_step = opll->out_step;
  }

  if (opll->conv) {
    EOPLL_RateConv_reset(opll->conv);
  }
}